

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cc
# Opt level: O0

BitMap * re2c::BitMap::find(Go *g,State *x)

{
  bool bVar1;
  BitMap *this;
  BitMap *local_28;
  BitMap *b;
  State *x_local;
  Go *g_local;
  
  local_28 = first;
  while( true ) {
    if (local_28 == (BitMap *)0x0) {
      this = (BitMap *)operator_new(0x20);
      BitMap(this,g,x);
      return this;
    }
    bVar1 = matches(local_28->go->span,local_28->go->nSpans,local_28->on,g->span,g->nSpans,x);
    if (bVar1) break;
    local_28 = local_28->next;
  }
  return local_28;
}

Assistant:

const BitMap *BitMap::find(const Go *g, const State *x)
{
	for (const BitMap *b = first; b; b = b->next)
	{
		if (matches(b->go->span, b->go->nSpans, b->on, g->span, g->nSpans, x))
		{
			return b;
		}
	}

	return new BitMap(g, x);
}